

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_http_client_async_blocking_timeout.cpp
# Opt level: O1

bool __thiscall Client::Handshake(Client *this)

{
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  *this_00;
  pointer pcVar1;
  bool bVar2;
  ostream *poVar3;
  error_code ec;
  error_code local_b8;
  undefined8 local_a8;
  error_category *peStack_a0;
  undefined1 local_98 [16];
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  *local_88;
  error_category *peStack_80;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  *local_58;
  error_category *peStack_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_98._0_8_ = 10000000000;
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::expires_after(&this->deadline_,(duration *)local_98);
  boost::system::error_code::error_code<boost::asio::error::basic_errors>
            (&local_b8,try_again,(type *)0x0);
  this_00 = &this->ssl_socket_;
  boost::asio::ssl::
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::set_verify_mode(this_00,0);
  pcVar1 = (this->host_)._M_dataplus._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + (this->host_)._M_string_length);
  boost::asio::ssl::
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::set_verify_callback<boost::asio::ssl::host_name_verification>
            (this_00,(host_name_verification *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  local_a8 = this_00;
  local_98._0_8_ = &local_b8;
  boost::asio::ssl::
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::initiate_async_handshake::operator()
            ((error_code *)&local_a8,
             (lambda_functor<boost::lambda::lambda_functor_base<boost::lambda::other_action<boost::lambda::assignment_action>,_boost::tuples::tuple<boost::lambda::lambda_functor<boost::lambda::identity<boost::system::error_code_&>_>,_boost::lambda::lambda_functor<boost::lambda::placeholder<1>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>
              *)local_98,client);
  do {
    boost::system::error_code::error_code((error_code *)&local_a8);
    boost::asio::detail::scheduler::run_one((this->io_context_).impl_,(error_code *)&local_a8);
    if (local_a8._4_1_ == true) {
      local_58 = local_a8;
      peStack_50 = peStack_a0;
      std::runtime_error::runtime_error((runtime_error *)local_98,"");
      local_98._0_8_ = &PTR__system_error_00162718;
      local_88 = local_58;
      peStack_80 = peStack_50;
      local_78._M_p = (pointer)&local_68;
      local_70 = 0;
      local_68._M_local_buf[0] = '\0';
      boost::throw_exception<boost::system::system_error>((system_error *)local_98);
    }
    boost::system::error_code::error_code<boost::asio::error::basic_errors>
              ((error_code *)local_98,try_again,(type *)0x0);
    if (local_b8.val_ != local_98._0_4_) break;
    bVar2 = (local_b8.cat_)->id_ == *(ulong_long_type *)(local_98._8_8_ + 8);
    if (*(ulong_long_type *)(local_98._8_8_ + 8) == 0) {
      bVar2 = local_b8.cat_ == (error_category *)local_98._8_8_;
    }
  } while (bVar2);
  if (local_b8.failed_ == true) {
    Stop(this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Handshake failed: ",0x12);
    (*(local_b8.cat_)->_vptr_error_category[4])(local_98,local_b8.cat_,(ulong)(uint)local_b8.val_);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_98._0_8_,local_98._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
         **)local_98._0_8_ != &local_88) {
      operator_delete((void *)local_98._0_8_);
    }
  }
  else {
    if (this->stopped_ != true) {
      return true;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Handshake timed out.",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
  }
  return false;
}

Assistant:

bool Client::Handshake() {
  deadline_.expires_after(std::chrono::seconds(kMaxHandshakeSeconds));

  boost::system::error_code ec = boost::asio::error::would_block;

#if SSL_VERIFY
  ssl_socket_.set_verify_mode(ssl::verify_peer);
#else
  ssl_socket_.set_verify_mode(ssl::verify_none);
#endif  // SSL_VERIFY

  // ssl::host_name_verification has been added since Boost 1.73 to replace
  // ssl::rfc2818_verification.
#if BOOST_VERSION < 107300
  ssl_socket_.set_verify_callback(ssl::rfc2818_verification(host_));
#else
  ssl_socket_.set_verify_callback(ssl::host_name_verification(host_));
#endif  // BOOST_VERSION < 107300

  // HandshakeHandler: void (boost::system::error_code)
  ssl_socket_.async_handshake(ssl::stream_base::client,
                              boost::lambda::var(ec) = boost::lambda::_1);

  // Block until the asynchronous operation has completed.
  do {
    io_context_.run_one();
  } while (ec == boost::asio::error::would_block);

  if (ec) {
    Stop();
    std::cerr << "Handshake failed: " << ec.message() << std::endl;
    return false;
  }

  if (stopped_) {
    // |timed_out_| should be true in this case.
    std::cerr << "Handshake timed out." << std::endl;
    return false;
  }

  return true;
}